

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskTable.cpp
# Opt level: O3

void __thiscall DiskTable::DiskTable(DiskTable *this,path *db_dir)

{
  long lVar1;
  directory_entry *pdVar2;
  size_type sVar3;
  char cVar4;
  file_type fVar5;
  value_type *pvVar6;
  _Node *p_Var7;
  ulong uVar8;
  directory_entry *node_path;
  _Alloc_hider _Var9;
  __normal_iterator<std::filesystem::__cxx11::directory_entry_*,_std::vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>_>
  __i;
  long lVar10;
  path *ppVar11;
  directory_entry *pdVar12;
  directory_iterator __begin2;
  directory_iterator dir;
  ifstream clock_is;
  path local_2d8;
  directory_iterator local_2a8;
  path local_298;
  directory_iterator local_270;
  directory_iterator local_260;
  path *local_250;
  path *local_248;
  path *local_240;
  path local_238 [13];
  
  (this->diskView).
  super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->diskView).
  super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->diskView).
  super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVar11 = &this->db_home;
  std::filesystem::__cxx11::path::path(ppVar11);
  this->LEVEL0_LIMIT = 2;
  this->LEVEL_FACTOR = 2;
  this->SSTABLE_SIZE_LIMIT = 2000000;
  local_250 = ppVar11;
  std::filesystem::__cxx11::path::operator=(ppVar11,db_dir);
  cVar4 = std::filesystem::status(db_dir);
  if ((cVar4 == -1) || (cVar4 == '\0')) {
    std::filesystem::create_directory(db_dir);
  }
  std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
            (&local_2d8,(char (*) [13])"sstable.lock",auto_format);
  std::filesystem::__cxx11::operator/(local_238,db_dir,&local_2d8);
  cVar4 = std::filesystem::status(local_238);
  std::filesystem::__cxx11::path::~path(local_238);
  std::filesystem::__cxx11::path::~path(&local_2d8);
  if ((cVar4 == -1) || (cVar4 == '\0')) {
    this->SSTableClock = 0;
  }
  else {
    std::filesystem::__cxx11::path::path<char[13],std::filesystem::__cxx11::path>
              (&local_298,(char (*) [13])"sstable.lock",auto_format);
    std::filesystem::__cxx11::operator/(&local_2d8,db_dir,&local_298);
    create_binary_ifstream(local_238);
    std::filesystem::__cxx11::path::~path(&local_2d8);
    std::filesystem::__cxx11::path::~path(&local_298);
    std::istream::read((char *)local_238,(long)&this->SSTableClock);
    std::ifstream::~ifstream(local_238);
  }
  local_238[0]._M_pathname.field_2._0_8_ =
       (this->diskView).
       super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_238[0]._M_pathname._M_dataplus._M_p =
       (pointer)(this->diskView).
                super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_238[0]._M_pathname._M_string_length =
       (size_type)
       (this->diskView).
       super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->diskView).
  super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->diskView).
  super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->diskView).
  super__Vector_base<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2d8._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_2d8._M_pathname._M_string_length = 0;
  local_2d8._M_pathname.field_2._M_allocated_capacity = 0;
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::~vector((vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
             *)local_238);
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::~vector((vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
             *)&local_2d8);
  std::
  vector<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>,_std::allocator<std::__cxx11::list<DiskTableNode,_std::allocator<DiskTableNode>_>_>_>
  ::reserve(&this->diskView,0x40);
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            (&local_260,db_dir,none,(error_code *)0x0);
  local_298._M_pathname._M_dataplus._M_p = (pointer)0x0;
  local_298._M_pathname._M_string_length = 0;
  local_298._M_pathname.field_2._M_allocated_capacity = 0;
  if ((path *)local_260._M_dir._M_refcount._M_pi == (path *)0x0) {
    local_238[0]._M_pathname._M_dataplus._M_p = (pointer)local_260._M_dir._M_ptr;
    local_238[0]._M_pathname._M_string_length = 0;
  }
  else {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_260._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_260._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
      local_238[0]._M_pathname._M_dataplus._M_p = (pointer)local_260._M_dir._M_ptr;
      local_238[0]._M_pathname._M_string_length = (size_type)local_260._M_dir._M_refcount._M_pi;
      if ((path *)local_260._M_dir._M_refcount._M_pi == (path *)0x0) goto LAB_00108259;
    }
    else {
      *(int *)(local_260._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_260._M_dir._M_refcount._M_pi + 8) + 1;
    }
    local_238[0]._M_pathname._M_dataplus._M_p = (pointer)local_260._M_dir._M_ptr;
    local_238[0]._M_pathname._M_string_length = (size_type)local_260._M_dir._M_refcount._M_pi;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(local_260._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_260._M_dir._M_refcount._M_pi + 8) + 1;
      UNLOCK();
    }
    else {
      *(int *)(local_260._M_dir._M_refcount._M_pi + 8) =
           *(int *)(local_260._M_dir._M_refcount._M_pi + 8) + 1;
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_260._M_dir._M_refcount._M_pi);
  }
LAB_00108259:
  while ((path *)local_238[0]._M_pathname._M_string_length != (path *)0x0) {
    pvVar6 = (value_type *)
             std::filesystem::__cxx11::directory_iterator::operator*
                       ((directory_iterator *)local_238);
    fVar5 = pvVar6->_M_type;
    if ((fVar5 == symlink) || (fVar5 == none)) {
      fVar5 = std::filesystem::status((path *)pvVar6);
    }
    if (fVar5 == directory) {
      std::
      vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
      ::push_back((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                   *)&local_298,pvVar6);
    }
    std::filesystem::__cxx11::directory_iterator::operator++((directory_iterator *)local_238);
  }
  if (local_298._M_pathname._M_dataplus._M_p == (pointer)local_298._M_pathname._M_string_length) {
    std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
              (&local_2d8,(char (*) [2])"0",auto_format);
    std::filesystem::__cxx11::operator/(local_238,db_dir,&local_2d8);
    std::filesystem::create_directory(local_238);
    std::filesystem::__cxx11::path::~path(local_238);
    std::filesystem::__cxx11::path::~path(&local_2d8);
    std::filesystem::__cxx11::path::path<char[2],std::filesystem::__cxx11::path>
              (&local_2d8,(char (*) [2])"0",auto_format);
    std::filesystem::__cxx11::operator/(local_238,db_dir,&local_2d8);
    std::
    vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
    ::emplace_back<std::filesystem::__cxx11::path>
              ((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                *)&local_298,local_238);
    std::filesystem::__cxx11::path::~path(local_238);
    std::filesystem::__cxx11::path::~path(&local_2d8);
  }
  sVar3 = local_298._M_pathname._M_string_length;
  _Var9._M_p = local_298._M_pathname._M_dataplus._M_p;
  if (local_298._M_pathname._M_dataplus._M_p != (pointer)local_298._M_pathname._M_string_length) {
    lVar10 = local_298._M_pathname._M_string_length - (long)local_298._M_pathname._M_dataplus._M_p;
    uVar8 = (lVar10 >> 4) * -0x5555555555555555;
    lVar1 = 0x3f;
    if (uVar8 != 0) {
      for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>>
              (local_298._M_pathname._M_dataplus._M_p,local_298._M_pathname._M_string_length,
               ((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    if (lVar10 < 0x301) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>>
                (_Var9._M_p,sVar3);
    }
    else {
      ppVar11 = (path *)(_Var9._M_p + 0x300);
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>>
                (_Var9._M_p,ppVar11);
      for (; ppVar11 != (path *)sVar3; ppVar11 = (path *)&ppVar11[1]._M_pathname._M_string_length) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,__gnu_cxx::__ops::_Val_comp_iter<DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>>
                  (ppVar11);
      }
    }
  }
  local_248 = (path *)local_298._M_pathname._M_string_length;
  if (local_298._M_pathname._M_dataplus._M_p != (pointer)local_298._M_pathname._M_string_length) {
    _Var9._M_p = local_298._M_pathname._M_dataplus._M_p;
    do {
      local_238[0]._M_pathname.field_2._M_allocated_capacity = (pointer)0x0;
      local_2d8._M_pathname.field_2._M_allocated_capacity = 0;
      local_2d8._M_pathname._M_dataplus._M_p = (pointer)0x0;
      local_2d8._M_pathname._M_string_length = 0;
      local_240 = (path *)_Var9._M_p;
      local_238[0]._M_pathname._M_dataplus._M_p = (pointer)local_238;
      local_238[0]._M_pathname._M_string_length = (size_type)local_238;
      std::filesystem::__cxx11::directory_iterator::directory_iterator
                (&local_270,(path *)_Var9._M_p,none,(error_code *)0x0);
      if (local_270._M_dir._M_refcount._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        local_2a8._M_dir._M_ptr = local_270._M_dir._M_ptr;
        local_2a8._M_dir._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_270._M_dir._M_refcount._M_pi + 8) =
               *(int *)(local_270._M_dir._M_refcount._M_pi + 8) + 1;
          UNLOCK();
          local_2a8._M_dir._M_ptr = local_270._M_dir._M_ptr;
          local_2a8._M_dir._M_refcount._M_pi = local_270._M_dir._M_refcount._M_pi;
          if (local_270._M_dir._M_refcount._M_pi ==
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_001084af;
        }
        else {
          *(int *)(local_270._M_dir._M_refcount._M_pi + 8) =
               *(int *)(local_270._M_dir._M_refcount._M_pi + 8) + 1;
        }
        local_2a8._M_dir._M_ptr = local_270._M_dir._M_ptr;
        local_2a8._M_dir._M_refcount._M_pi = local_270._M_dir._M_refcount._M_pi;
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)(local_270._M_dir._M_refcount._M_pi + 8) =
               *(int *)(local_270._M_dir._M_refcount._M_pi + 8) + 1;
          UNLOCK();
        }
        else {
          *(int *)(local_270._M_dir._M_refcount._M_pi + 8) =
               *(int *)(local_270._M_dir._M_refcount._M_pi + 8) + 1;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_270._M_dir._M_refcount._M_pi);
      }
LAB_001084af:
      while (local_2a8._M_dir._M_refcount._M_pi !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        pvVar6 = (value_type *)std::filesystem::__cxx11::directory_iterator::operator*(&local_2a8);
        std::
        vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
        ::push_back((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                     *)&local_2d8,pvVar6);
        std::filesystem::__cxx11::directory_iterator::operator++(&local_2a8);
      }
      if (local_270._M_dir._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)
      {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_270._M_dir._M_refcount._M_pi);
      }
      sVar3 = local_2d8._M_pathname._M_string_length;
      _Var9._M_p = local_2d8._M_pathname._M_dataplus._M_p;
      pdVar2 = (directory_entry *)local_2d8._M_pathname._M_string_length;
      if (local_2d8._M_pathname._M_dataplus._M_p != (pointer)local_2d8._M_pathname._M_string_length)
      {
        lVar10 = local_2d8._M_pathname._M_string_length -
                 (long)local_2d8._M_pathname._M_dataplus._M_p;
        uVar8 = (lVar10 >> 4) * -0x5555555555555555;
        lVar1 = 0x3f;
        if (uVar8 != 0) {
          for (; uVar8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
          }
        }
        std::
        __introsort_loop<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>>
                  (local_2d8._M_pathname._M_dataplus._M_p,local_2d8._M_pathname._M_string_length,
                   ((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
        if (lVar10 < 0x301) {
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>>
                    (_Var9._M_p,sVar3);
          _Var9._M_p = local_2d8._M_pathname._M_dataplus._M_p;
          pdVar2 = (directory_entry *)local_2d8._M_pathname._M_string_length;
        }
        else {
          pdVar12 = (directory_entry *)(_Var9._M_p + 0x300);
          std::
          __insertion_sort<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,__gnu_cxx::__ops::_Iter_comp_iter<DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>>
                    (_Var9._M_p,pdVar12);
          for (; _Var9._M_p = local_2d8._M_pathname._M_dataplus._M_p,
              pdVar2 = (directory_entry *)local_2d8._M_pathname._M_string_length,
              pdVar12 != (directory_entry *)sVar3; pdVar12 = pdVar12 + 1) {
            std::
            __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::filesystem::__cxx11::directory_entry*,std::vector<std::filesystem::__cxx11::directory_entry,std::allocator<std::filesystem::__cxx11::directory_entry>>>,__gnu_cxx::__ops::_Val_comp_iter<DiskTable::DiskTable(std::filesystem::__cxx11::path&)::__0>>
                      (pdVar12);
          }
        }
      }
      for (; (directory_entry *)_Var9._M_p != pdVar2;
          _Var9._M_p = (pointer)((long)_Var9._M_p + 0x30)) {
        p_Var7 = std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>::
                 _M_create_node<std::filesystem::__cxx11::directory_entry_const&>
                           ((list<DiskTableNode,std::allocator<DiskTableNode>> *)local_238,
                            (directory_entry *)_Var9._M_p);
        std::__detail::_List_node_base::_M_hook(&p_Var7->super__List_node_base);
        local_238[0]._M_pathname.field_2._0_8_ =
             local_238[0]._M_pathname.field_2._M_allocated_capacity + 1;
      }
      std::
      vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
      ::emplace_back<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>
                ((vector<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>,std::allocator<std::__cxx11::list<DiskTableNode,std::allocator<DiskTableNode>>>>
                  *)this,(list<DiskTableNode,_std::allocator<DiskTableNode>_> *)local_238);
      std::
      vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
      ::~vector((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
                 *)&local_2d8);
      std::__cxx11::_List_base<DiskTableNode,_std::allocator<DiskTableNode>_>::_M_clear
                ((_List_base<DiskTableNode,_std::allocator<DiskTableNode>_> *)local_238);
      _Var9._M_p = (pointer)&local_240[1]._M_pathname._M_string_length;
    } while ((path *)_Var9._M_p != local_248);
  }
  std::
  vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
  ::~vector((vector<std::filesystem::__cxx11::directory_entry,_std::allocator<std::filesystem::__cxx11::directory_entry>_>
             *)&local_298);
  if ((path *)local_260._M_dir._M_refcount._M_pi != (path *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_260._M_dir._M_refcount._M_pi);
  }
  return;
}

Assistant:

DiskTable::DiskTable(path &db_dir) {
    /*
     * Scan db_dir, build diskView.
     * Structure of db_dir like this:
         db_dir
              | <dir> 0
              | <dir> 1
              | <dir> ...
              | sstable.lock // store SSTableClock, for simplifying naming of SSTable.
     * Every sub dir corresponding to a level according to its name(level number)
     * In every sub dir, there are some SSTable, whose filename is just SSTableClock when it was written to disk,
     * such naming is for convenience of relocating SSTable in a level when compaction.
    */
    static auto compare_dir_entry_by_numeric_asc = [](directory_entry &candidate, directory_entry &current) {
        if (current.is_directory()) {
            auto candidate_dir_name = --(candidate.path().end());
            auto current_dir_name = --(current.path().end());
            while (*candidate_dir_name == "") {
                candidate_dir_name--;
            }
            while (*current_dir_name == "") {
                current_dir_name--;
            }
            return atoll(candidate_dir_name->c_str()) < atoll(current_dir_name->c_str());
        } else {
            return atoll(candidate.path().filename().c_str()) < atoll(current.path().filename().c_str());
        }
    };
    db_home = db_dir;
    if (!exists(db_dir)) {
        create_directory(db_dir);
    }
    if (!exists(db_dir / "sstable.lock")) {
        SSTableClock = 0;
    } else {
        auto clock_is = create_binary_ifstream(db_dir / "sstable.lock");
        bytes_read(clock_is, &SSTableClock);
    }

    diskView = DiskView{};
    diskView.reserve(64);
    auto dir = directory_iterator{db_dir};
    auto dir_buf = std::vector<directory_entry>{}; // directory_iterator is out-of-order, use a buf to sort them.
    for (const auto &d:dir) {
        if (d.is_directory()) {
            // Skip other files in db_dir.
            dir_buf.push_back(d);
        }
    }
    if (dir_buf.empty()) {
        create_directory(db_dir / "0");
        dir_buf.emplace_back(db_dir / "0");
    }
    std::sort(dir_buf.begin(), dir_buf.end(), compare_dir_entry_by_numeric_asc);
    for (const auto &level:dir_buf) {
        auto new_view_level = DiskViewLevel{};
        auto node_path_buf = std::vector<directory_entry>{};
        for (const auto &sstable_file:directory_iterator{level.path()}) {
            node_path_buf.push_back(sstable_file);
        }
        // To ensure correctness, we must enforce that sstable written later in level 0 placed into diskView[0][1](if exists)
        std::sort(node_path_buf.begin(), node_path_buf.end(), compare_dir_entry_by_numeric_asc);
        for (const auto &node_path:node_path_buf) {
            new_view_level.emplace_back(node_path);
        }
        diskView.push_back(std::move(new_view_level));
    }
}